

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O2

altsvc * altsvc_createid(char *srchost,char *dsthost,size_t dlen,alpnid srcalpnid,alpnid dstalpnid,
                        uint srcport,uint dstport)

{
  unsigned_short uVar1;
  altsvc *as;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  
  as = (altsvc *)(*Curl_ccalloc)(1,0x50);
  if (as != (altsvc *)0x0) {
    sVar2 = strlen(srchost);
    if (dlen == 0 || sVar2 == 0) {
      (*Curl_cfree)(as);
    }
    else {
      if ((sVar2 < 3) || (*srchost != '[')) {
        lVar4 = -(ulong)(srchost[sVar2 - 1] == '.');
      }
      else {
        srchost = srchost + 1;
        lVar4 = -2;
      }
      if ((2 < dlen) && (*dsthost == '[')) {
        dsthost = dsthost + 1;
        dlen = dlen - 2;
      }
      pcVar3 = (char *)Curl_memdup0(srchost,sVar2 + lVar4);
      (as->src).host = pcVar3;
      if (pcVar3 != (char *)0x0) {
        pcVar3 = (char *)Curl_memdup0(dsthost,dlen);
        (as->dst).host = pcVar3;
        if (pcVar3 != (char *)0x0) {
          (as->src).alpnid = srcalpnid;
          (as->dst).alpnid = dstalpnid;
          uVar1 = curlx_ultous((ulong)srcport);
          (as->src).port = uVar1;
          uVar1 = curlx_ultous((ulong)dstport);
          (as->dst).port = uVar1;
          return as;
        }
      }
      altsvc_free(as);
    }
  }
  return (altsvc *)0x0;
}

Assistant:

static struct altsvc *altsvc_createid(const char *srchost,
                                      const char *dsthost,
                                      size_t dlen, /* dsthost length */
                                      enum alpnid srcalpnid,
                                      enum alpnid dstalpnid,
                                      unsigned int srcport,
                                      unsigned int dstport)
{
  struct altsvc *as = calloc(1, sizeof(struct altsvc));
  size_t hlen;
  if(!as)
    return NULL;
  hlen = strlen(srchost);
  DEBUGASSERT(hlen);
  DEBUGASSERT(dlen);
  if(!hlen || !dlen) {
    /* bad input */
    free(as);
    return NULL;
  }
  if((hlen > 2) && srchost[0] == '[') {
    /* IPv6 address, strip off brackets */
    srchost++;
    hlen -= 2;
  }
  else if(srchost[hlen - 1] == '.')
    /* strip off trailing dot */
    hlen--;
  if((dlen > 2) && dsthost[0] == '[') {
    /* IPv6 address, strip off brackets */
    dsthost++;
    dlen -= 2;
  }

  as->src.host = Curl_memdup0(srchost, hlen);
  if(!as->src.host)
    goto error;

  as->dst.host = Curl_memdup0(dsthost, dlen);
  if(!as->dst.host)
    goto error;

  as->src.alpnid = srcalpnid;
  as->dst.alpnid = dstalpnid;
  as->src.port = curlx_ultous(srcport);
  as->dst.port = curlx_ultous(dstport);

  return as;
error:
  altsvc_free(as);
  return NULL;
}